

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImDrawListSplitter::~ImDrawListSplitter(ImDrawListSplitter *this)

{
  int *piVar1;
  ImDrawChannel *pIVar2;
  
  ClearFreeMemory(this);
  pIVar2 = (this->_Channels).Data;
  if (pIVar2 != (ImDrawChannel *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
  }
  return;
}

Assistant:

inline ~ImDrawListSplitter() { ClearFreeMemory(); }